

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Base_ptr p_Var1;
  gpt2_batch batch;
  gpt2_batch batch_00;
  gpt2_batch batch_01;
  ggml_gallocr_t pgVar2;
  pointer pfVar3;
  bool bVar4;
  int iVar5;
  id iVar6;
  uint uVar7;
  long lVar8;
  time_t tVar9;
  long lVar10;
  undefined8 uVar11;
  ggml_cgraph *pgVar12;
  mapped_type *pmVar13;
  size_t __i;
  long lVar14;
  _Rb_tree_header *p_Var15;
  _Base_ptr p_Var16;
  uint uVar17;
  ulong uVar18;
  _Rb_tree_header *p_Var19;
  int in_R8D;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  id id;
  vector<int,_std::allocator<int>_> embd_inp;
  vector<float,_std::allocator<float>_> logits;
  vector<int,_std::allocator<int>_> i_batch;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  streams;
  gpt_params params;
  gpt_vocab vocab;
  mt19937 rng;
  undefined4 in_stack_ffffffffffffe928;
  allocator_type local_16c1;
  ulong local_16c0;
  vector<int,_std::allocator<int>_> local_16b8;
  float local_16a0;
  uint local_169c;
  ggml_gallocr_t local_1698;
  long local_1690;
  uint local_1688;
  uint local_1684;
  uint local_1680;
  int local_167c;
  gpt2_batch local_1678;
  vector<float,_std::allocator<float>_> local_1648;
  vector<int,_std::allocator<int>_> local_1628;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1610;
  long local_15f8;
  gpt2_seq_id *local_15f0;
  gpt2_pos *local_15e8;
  id *local_15e0;
  int8_t *local_15d8;
  double local_15d0;
  double local_15c8;
  long local_15c0;
  gpt_params local_15b8;
  undefined1 local_1518 [72];
  pointer local_14d0;
  pointer pgStack_14c8;
  pointer local_14c0;
  undefined8 local_14a8;
  uint32_t local_14a0;
  vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_> local_1498;
  ggml_backend_buffer_t local_1480;
  ggml_context *local_1478;
  ggml_backend_t local_1470;
  ggml_backend_buffer_t local_1468;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  local_1460;
  gpt_vocab local_1430;
  mt19937 local_13b8;
  
  ggml_time_init();
  lVar8 = ggml_time_us();
  gpt_params::gpt_params(&local_15b8);
  bVar4 = gpt_params_parse(argc,argv,&local_15b8);
  uVar22 = 1;
  if (bVar4) {
    if (local_15b8.seed < 0) {
      tVar9 = time((time_t *)0x0);
      local_15b8.seed = (int32_t)tVar9;
    }
    printf("%s: seed = %d\n","main",(ulong)(uint)local_15b8.seed);
    local_13b8._M_x[0] = (unsigned_long)(uint)local_15b8.seed;
    lVar14 = 1;
    uVar18 = local_13b8._M_x[0];
    do {
      uVar18 = (ulong)(((uint)(uVar18 >> 0x1e) ^ (uint)uVar18) * 0x6c078965 + (int)lVar14);
      local_13b8._M_x[lVar14] = uVar18;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x270);
    local_13b8._M_p = 0x270;
    if (local_15b8.prompt._M_string_length == 0) {
      gpt_random_prompt_abi_cxx11_((string *)local_1518,&local_13b8);
      std::__cxx11::string::operator=((string *)&local_15b8.prompt,(string *)local_1518);
      if ((undefined1 *)local_1518._0_8_ != local_1518 + 0x10) {
        operator_delete((void *)local_1518._0_8_,local_1518._16_8_ + 1);
      }
    }
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1430.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1430.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1430.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1460._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1460._M_impl.super__Rb_tree_header._M_header;
    local_1518._0_8_ = (pointer)0x4000000c451;
    local_1518._8_8_ = 0xc00000300;
    local_1518._16_8_ = 0x10000000c;
    local_1518._24_4_ = 0x3727c5ac;
    local_14d0 = (pointer)0x0;
    pgStack_14c8 = (pointer)0x0;
    local_14c0 = (pointer)0x0;
    local_14a8 = 0;
    local_14a0 = 0;
    local_1498.super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1498.super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1498.super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1470 = (ggml_backend_t)0x0;
    local_1460._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1460._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1460._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1460._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1460._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1430.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1430.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar14 = ggml_time_us();
    bVar4 = gpt2_model_load(&local_15b8.model,(gpt2_model *)local_1518,&local_1430,local_15b8.n_ctx,
                            in_R8D);
    bVar23 = !bVar4;
    if (bVar23) {
      main_cold_1();
      local_16a0 = 0.0;
    }
    else {
      lVar10 = ggml_time_us();
      test_gpt_tokenizer(&local_1430,&local_15b8.token_test);
      local_16a0 = (float)(lVar10 - lVar14);
    }
    uVar22 = (uint)bVar23;
    if (bVar4) {
      gpt_tokenize(&local_16b8,&local_1430,&local_15b8.prompt);
      uVar21 = (ulong)local_15b8.n_parallel;
      uVar18 = (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (uVar18 <= uVar21) {
        uVar18 = uVar21;
      }
      gpt2_batch_init(&local_1678,(int32_t)uVar18,0);
      uVar11 = ggml_backend_get_default_buffer_type(local_1470);
      local_1698 = (ggml_gallocr_t)ggml_gallocr_new(uVar11);
      local_1678.n_tokens = (int32_t)uVar18;
      pgVar12 = gpt2_graph((gpt2_model *)local_1518,&local_1678,true);
      pgVar2 = local_1698;
      ggml_gallocr_reserve(local_1698,pgVar12);
      uVar11 = ggml_gallocr_get_buffer_size(pgVar2,0);
      auVar24._8_4_ = (int)((ulong)uVar11 >> 0x20);
      auVar24._0_8_ = uVar11;
      auVar24._12_4_ = 0x45300000;
      fprintf(_stderr,"%s: compute buffer size: %.2f MB\n",
              SUB84(((auVar24._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) * 0.0009765625
                    * 0.0009765625,0),"main");
      local_1648.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1648.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1648.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar18 = (ulong)((long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      uVar22 = (uint)uVar18;
      if (0 < (int)uVar22) {
        uVar20 = 0;
        do {
          local_1678.token[uVar20] =
               local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar20];
          local_1678.pos[uVar20] = (gpt2_pos)uVar20;
          local_1678.seq_id[uVar20] = 0;
          local_1678.logits[uVar20] = '\0';
          uVar20 = uVar20 + 1;
        } while ((uVar22 & 0x7fffffff) != uVar20);
      }
      local_15d8 = local_1678.logits;
      local_1678.logits[(long)(int)uVar22 + -1] = '\x01';
      batch._4_4_ = local_1678._4_4_;
      batch.n_tokens = uVar22;
      batch.token = local_1678.token;
      batch.embd = local_1678.embd;
      batch.pos = local_1678.pos;
      batch.seq_id = local_1678.seq_id;
      batch.logits = local_1678.logits;
      local_1678.n_tokens = uVar22;
      iVar5 = gpt2_decode((gpt2_model *)local_1518,local_1698,batch,local_15b8.n_threads,&local_1648
                         );
      if (iVar5 == 0) {
        local_16c0 = uVar21;
        if (1 < local_15b8.n_parallel) {
          uVar17 = 0x7fffffff;
          if (uVar22 < 0x7fffffff) {
            uVar17 = uVar22;
          }
          iVar5 = 1;
          do {
            local_1610.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar5;
            if (local_14a8._4_4_ != 0) {
              uVar21 = 0;
              do {
                p_Var15 = &local_1498.
                           super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar21].seq_id._M_t._M_impl.
                           super__Rb_tree_header;
                p_Var1 = local_1498.super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar21].seq_id._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_parent;
                p_Var16 = &p_Var15->_M_header;
                for (; (_Rb_tree_header *)p_Var1 != (_Rb_tree_header *)0x0;
                    p_Var1 = (&p_Var1->_M_left)[(uint)*(size_t *)(p_Var1 + 1) >> 0x1f]) {
                  if (-1 < (int)(uint)*(size_t *)(p_Var1 + 1)) {
                    p_Var16 = p_Var1;
                  }
                }
                p_Var19 = p_Var15;
                if (((_Rb_tree_header *)p_Var16 != p_Var15) &&
                   (p_Var19 = (_Rb_tree_header *)p_Var16,
                   0 < (int)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
                  p_Var19 = p_Var15;
                }
                if ((p_Var19 != p_Var15) &&
                   ((uint)local_1498.super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21].pos < uVar17)) {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&local_1498.
                                 super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar21].seq_id,
                             (int *)&local_1610);
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 < local_14a8 >> 0x20);
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 != (int)local_16c0);
        }
        if (1 < (int)local_16c0) {
          printf("\n\n%s: generating %d sequences ...\n","main");
        }
        iVar5 = local_1518._4_4_ -
                (int)((ulong)((long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
        if (local_15b8.n_predict <= iVar5) {
          iVar5 = local_15b8.n_predict;
        }
        local_15b8.n_predict = iVar5;
        printf("%s: prompt: \'%s\'\n","main",local_15b8.prompt._M_dataplus._M_p);
        printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",
               (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
        if (0 < (int)((ulong)((long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2)) {
          lVar14 = 0;
          do {
            printf("%d ",(ulong)(uint)local_16b8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar14]);
            lVar14 = lVar14 + 1;
            iVar5 = (int)((ulong)((long)local_16b8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2);
            if (7 < iVar5) {
              iVar5 = 8;
            }
          } while (lVar14 < iVar5);
        }
        puts("\n");
        uVar21 = local_16c0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1610,local_16c0,(allocator_type *)&local_1628);
        iVar6 = uVar22 - 1;
        local_15f8 = lVar8;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_1628,uVar21,(value_type_conflict2 *)&stack0xffffffffffffe92c,&local_16c1);
        local_167c = local_15b8.top_k;
        local_15c0 = (long)(int)local_1518._0_4_;
        local_15c8 = (double)local_15b8.top_p;
        local_15d0 = (double)local_15b8.temp;
        local_1680 = (local_15b8.n_predict + uVar22) - 1;
        local_15e0 = local_1678.token;
        local_15e8 = local_1678.pos;
        local_15f0 = local_1678.seq_id;
        local_1688 = local_15b8.n_predict + uVar22;
        if ((int)(local_15b8.n_predict + uVar22) <= (int)uVar22) {
          local_1688 = uVar22;
        }
        local_169c = 0;
        local_1690 = 0;
        lVar8 = 0;
        uVar22 = (uint)bVar23;
        while (uVar17 = (uint)uVar18, uVar17 != local_1688) {
          local_1678.n_tokens = 0;
          local_1684 = uVar22;
          if ((int)uVar21 < 1) {
            uVar22 = 0;
          }
          else {
            uVar20 = 0;
            uVar22 = 0;
            do {
              pfVar3 = local_1648.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar5 = local_1628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar20];
              if (-1 < (long)iVar5) {
                lVar14 = ggml_time_us();
                iVar6 = gpt_sample_top_k_top_p
                                  (&local_1430,pfVar3 + iVar5 * local_15c0,local_167c,local_15c8,
                                   local_15d0,&local_13b8);
                lVar10 = ggml_time_us();
                if (((~local_15b8.ignore_eos & iVar6 == 0xc450) == 0) && (uVar17 != local_1680)) {
                  pmVar13 = std::
                            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&local_1430.id_to_token,
                                         (key_type *)&stack0xffffffffffffe92c);
                  if ((int)local_16c0 == 1) {
                    printf("%s",(pmVar13->_M_dataplus)._M_p);
                    fflush(_stdout);
                  }
                  std::__cxx11::string::_M_append
                            ((char *)(uVar20 * 0x20 +
                                     CONCAT44(local_1610.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              (int)local_1610.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)),
                             (ulong)(pmVar13->_M_dataplus)._M_p);
                  local_15e0[(int)uVar22] = iVar6;
                  local_15e8[(int)uVar22] = uVar17;
                  local_15f0[(int)uVar22] = (gpt2_seq_id)uVar20;
                  local_15d8[(int)uVar22] = '\x01';
                  local_1628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20] = uVar22;
                  uVar22 = uVar22 + 1;
                  local_169c = local_169c + 1;
                }
                else {
                  local_1628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20] = -1;
                  putchar(10);
                  if (1 < (int)local_16c0) {
                    printf("%s: stream %d finished at n_cur = %d","main",uVar20 & 0xffffffff,uVar18)
                    ;
                  }
                }
                lVar8 = (lVar8 - lVar14) + lVar10;
                uVar21 = local_16c0;
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar21);
          }
          local_1678.n_tokens = uVar22;
          if (uVar22 == 0) break;
          lVar14 = ggml_time_us();
          batch_00._4_4_ = local_1678._4_4_;
          batch_00.n_tokens = local_1678.n_tokens;
          batch_00.token = local_1678.token;
          batch_00.embd = local_1678.embd;
          batch_00.pos = local_1678.pos;
          batch_00.seq_id = local_1678.seq_id;
          batch_00.logits = local_1678.logits;
          uVar7 = gpt2_decode((gpt2_model *)local_1518,local_1698,batch_00,local_15b8.n_threads,
                              &local_1648);
          uVar22 = local_1684;
          if (uVar7 == 0) {
            lVar10 = ggml_time_us();
            local_1690 = (local_1690 - lVar14) + lVar10;
          }
          else {
            fprintf(_stderr,"%s : failed to eval, return code %d\n","main",(ulong)uVar7);
            uVar22 = 1;
          }
          uVar18 = (ulong)(uVar17 + 1);
          if (uVar7 != 0) goto LAB_0010b6bc;
        }
        if (1 < (int)uVar21) {
          putchar(10);
          lVar14 = 0;
          uVar22 = 0;
          do {
            printf("sequence %d:\n\n%s%s\n\n",(ulong)uVar22,local_15b8.prompt._M_dataplus._M_p,
                   *(undefined8 *)
                    (CONCAT44(local_1610.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_1610.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + lVar14));
            uVar22 = uVar22 + 1;
            lVar14 = lVar14 + 0x20;
          } while (uVar21 << 5 != lVar14);
        }
        lVar14 = ggml_time_us();
        puts("\n");
        printf("%s:     n_decoded = %8d\n","main",(ulong)local_169c);
        printf("%s:     load time = %8.2f ms\n",SUB84((double)(local_16a0 / 1000.0),0),"main");
        printf("%s:   sample time = %8.2f ms\n",SUB84((double)((float)lVar8 / 1000.0),0),"main");
        printf("%s:  predict time = %8.2f ms\n",SUB84((double)((float)local_1690 / 1000.0),0),"main"
              );
        printf("%s:    total time = %8.2f ms\n",
               SUB84((double)((float)(lVar14 - local_15f8) / 1000.0),0),"main");
        batch_01.token = (id *)local_1678.embd;
        batch_01._0_8_ = local_1678.token;
        batch_01.embd = (float *)local_1678.pos;
        batch_01.pos = local_1678.seq_id;
        batch_01.seq_id = (gpt2_seq_id *)local_1678.logits;
        batch_01.logits._0_4_ = in_stack_ffffffffffffe928;
        batch_01.logits._4_4_ = iVar6;
        gpt2_batch_free(batch_01);
        ggml_free(local_1478);
        ggml_gallocr_free(local_1698);
        ggml_backend_buffer_free(local_1468);
        ggml_backend_buffer_free(local_1480);
        uVar22 = 0;
        ggml_backend_free(local_1470);
LAB_0010b6bc:
        if (local_1628.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_1628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1610);
        goto LAB_0010b6e6;
      }
      printf("%s: gpt2_decode() failed\n","main");
      uVar22 = 1;
LAB_0010b6e6:
      if (local_1648.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1648.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1648.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1648.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
    ::~_Rb_tree(&local_1460);
    std::vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>::~vector(&local_1498);
    if (local_14d0 != (pointer)0x0) {
      operator_delete(local_14d0,(long)local_14c0 - (long)local_14d0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1430.special_tokens);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1430.id_to_token._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)&local_1430);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15b8.token_test._M_dataplus._M_p != &local_15b8.token_test.field_2) {
    operator_delete(local_15b8.token_test._M_dataplus._M_p,
                    local_15b8.token_test.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15b8.prompt._M_dataplus._M_p != &local_15b8.prompt.field_2) {
    operator_delete(local_15b8.prompt._M_dataplus._M_p,
                    local_15b8.prompt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15b8.model._M_dataplus._M_p != &local_15b8.model.field_2) {
    operator_delete(local_15b8.model._M_dataplus._M_p,
                    local_15b8.model.field_2._M_allocated_capacity + 1);
  }
  return uVar22;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab, params.n_ctx, params.n_gpu_layers)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    const int n_parallel = params.n_parallel;
    const int n_batch_max = std::max(embd_inp.size(), (size_t)n_parallel);

    // create a gpt2_batch
    // we use this object to submit token data for decoding
    gpt2_batch batch = gpt2_batch_init(n_batch_max, 0);

    // prepare required memory and allocate the compute buffer
    ggml_gallocr_t allocr = NULL;
    {
        // create an allocator to measure the memory usage
        allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(model.backend));

        // create the worst case graph for memory usage estimation
        batch.n_tokens = n_batch_max;
        struct ggml_cgraph * gf = gpt2_graph(model, batch, true);

        // pre-allocate the compute buffer for the worst case (optional)
        ggml_gallocr_reserve(allocr, gf);
        size_t mem_size = ggml_gallocr_get_buffer_size(allocr, 0);
        fprintf(stderr, "%s: compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // evaluate the initial prompt
    batch.n_tokens = embd_inp.size();

    for (int32_t i = 0; i < batch.n_tokens; i++) {
        batch.token[i]  = embd_inp[i];
        batch.pos[i]    = i;
        batch.seq_id[i] = 0;
        batch.logits[i] = false;
    }

    // gpt2_decode will output logits only for the last token of the prompt
    batch.logits[batch.n_tokens - 1] = true;

    if (gpt2_decode(model, allocr, batch, params.n_threads, logits) != 0) {
        printf("%s: gpt2_decode() failed\n", __func__);
        return 1;
    }

    // assign the system KV cache to all parallel sequences
    // this way, the parallel sequences will "reuse" the prompt tokens without having to copy them
    for (int32_t i = 1; i < n_parallel; ++i) {
        gpt2_kv_cache_seq_cp(model.kv_cache, 0, i, 0, batch.n_tokens);
    }

    if (n_parallel > 1) {
        printf("\n\n%s: generating %d sequences ...\n", __func__, n_parallel);
    }

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    std::vector<gpt_vocab::token> streams(n_parallel);

    // remember the batch index of the last token for each parallel sequence
    // we need this to determine which logits to sample from
    std::vector<int32_t> i_batch(n_parallel, batch.n_tokens - 1);

    int n_cur     = batch.n_tokens;
    int n_len     = batch.n_tokens + params.n_predict;
    int n_decoded = 0;

    const int   n_vocab = model.hparams.n_vocab;
    const int   top_k = params.top_k;
    const float top_p = params.top_p;
    const float temp  = params.temp;

    while (n_cur < n_len) {
        batch.n_tokens = 0;

        for (int32_t i = 0; i < n_parallel; ++i) {
            if (i_batch[i] < 0) {
                // the stream has already finished
                continue;
            }

            auto * logits_i = logits.data() + i_batch[i]*n_vocab;

            gpt_vocab::id id = 0;
            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits_i, top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // is it an end of stream? -> mark the stream as finished
            if ((!params.ignore_eos && id == 50256) || n_cur == n_len - 1) {
                i_batch[i] = -1;
                printf("\n");
                if (n_parallel > 1) {
                    printf("%s: stream %d finished at n_cur = %d", __func__, i, n_cur);
                }

                continue;
            }

            auto& token = vocab.id_to_token[id];
            if (n_parallel == 1) {
                printf("%s", token.c_str());
                fflush(stdout);
            }

            streams[i] += token;

            // push this new token for next evaluation
            batch.token [batch.n_tokens] = id;
            batch.pos   [batch.n_tokens] = n_cur;
            batch.seq_id[batch.n_tokens] = i;
            batch.logits[batch.n_tokens] = true;

            i_batch[i] = batch.n_tokens;

            batch.n_tokens += 1;

            n_decoded += 1;
        }

        // all streams are finished
        if (batch.n_tokens == 0) {
            break;
        }

        n_cur += 1;

        {
            const int64_t t_start_us = ggml_time_us();

            // evaluate the current batch with the transformer model
            int ret_code = gpt2_decode(model, allocr, batch, params.n_threads, logits);
            if (ret_code != 0) {
                fprintf(stderr, "%s : failed to eval, return code %d\n", __func__, ret_code);
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }
    }

    if (n_parallel > 1) {
        printf("\n");

        for (int32_t i = 0; i < n_parallel; ++i) {
            printf("sequence %d:\n\n%s%s\n\n", i, params.prompt.c_str(), streams[i].c_str());
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     n_decoded = %8d\n",      __func__, n_decoded);
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms\n", __func__, t_predict_us/1000.0f);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    gpt2_batch_free(batch);
    ggml_free(model.ctx_w);

    ggml_gallocr_free(allocr);
    ggml_backend_buffer_free(model.buffer_w);
    ggml_backend_buffer_free(model.kv_cache.buffer);
    ggml_backend_free(model.backend);

    return 0;
}